

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

string * __thiscall
GraphPropagator::available_to_dot_abi_cxx11_
          (string *__return_storage_ptr__,GraphPropagator *this,int *arr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BoolView *pBVar2;
  GraphPropagator *pGVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong *puVar10;
  long *plVar11;
  string *psVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  string __str;
  string __str_2;
  string __str_1;
  long *local_f8;
  long local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  string *local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  GraphPropagator *local_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  int *local_60;
  long local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  local_b8 = __return_storage_ptr__;
  local_60 = arr;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"graph {\n","");
  uVar16 = (this->vs).sz;
  local_88 = this;
  if (0 < (int)uVar16) {
    uVar14 = 0;
    do {
      pBVar2 = (this->vs).data;
      if ((sat.assigns.data[(uint)pBVar2[uVar14].v] != '\0') &&
         ((uint)pBVar2[uVar14].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar2[uVar14].v])) {
        uVar16 = 1;
        if (9 < uVar14) {
          uVar4 = 4;
          uVar9 = uVar14;
          do {
            uVar16 = uVar4;
            uVar13 = (uint)uVar9;
            if (uVar13 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_001ca4fa;
            }
            if (uVar13 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_001ca4fa;
            }
            if (uVar13 < 10000) goto LAB_001ca4fa;
            uVar9 = (uVar9 & 0xffffffff) / 10000;
            uVar4 = uVar16 + 4;
          } while (99999 < uVar13);
          uVar16 = uVar16 + 1;
        }
LAB_001ca4fa:
        local_b0 = &local_a0;
        std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar16);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,uVar16,(uint)uVar14);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1d8ae4);
        this = local_88;
        local_d8 = &local_c8;
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_c8 = *puVar10;
          lStack_c0 = plVar7[3];
        }
        else {
          local_c8 = *puVar10;
          local_d8 = (ulong *)*plVar7;
        }
        local_d0 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_f8 = &local_e8;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_e8 = *plVar11;
          lStack_e0 = plVar7[3];
        }
        else {
          local_e8 = *plVar11;
          local_f8 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_f8);
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        uVar16 = (this->vs).sz;
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)(int)uVar16);
  }
  uVar16 = (this->es).sz;
  psVar12 = local_b8;
  local_90 = paVar1;
  if (0 < (int)uVar16) {
    lVar15 = 0;
    do {
      pBVar2 = (this->es).data;
      if ((sat.assigns.data[(uint)pBVar2[lVar15].v] == '\0') ||
         ((uint)pBVar2[lVar15].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar2[lVar15].v])) {
        local_58 = lVar15 * 3;
        uVar16 = **(uint **)&(this->endnodes).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar15].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data;
        uVar4 = -uVar16;
        if (0 < (int)uVar16) {
          uVar4 = uVar16;
        }
        uVar13 = 1;
        if (9 < uVar4) {
          uVar14 = (ulong)uVar4;
          uVar5 = 4;
          do {
            uVar13 = uVar5;
            uVar6 = (uint)uVar14;
            if (uVar6 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_001ca712;
            }
            if (uVar6 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_001ca712;
            }
            if (uVar6 < 10000) goto LAB_001ca712;
            uVar14 = uVar14 / 10000;
            uVar5 = uVar13 + 4;
          } while (99999 < uVar6);
          uVar13 = uVar13 + 1;
        }
LAB_001ca712:
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct
                  ((ulong)local_50,(char)uVar13 - (char)((int)uVar16 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar16 >> 0x1f),uVar13,uVar4)
        ;
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1d8ae4);
        local_b0 = &local_a0;
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_a0 = *plVar11;
          lStack_98 = plVar7[3];
        }
        else {
          local_a0 = *plVar11;
          local_b0 = (long *)*plVar7;
        }
        local_a8 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
        psVar12 = local_b8;
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_c8 = *puVar10;
          lStack_c0 = plVar7[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *puVar10;
          local_d8 = (ulong *)*plVar7;
        }
        local_d0 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        uVar16 = *(uint *)(*(long *)((long)&(((local_88->endnodes).
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data + local_58 * 8) + 4);
        uVar4 = -uVar16;
        if (0 < (int)uVar16) {
          uVar4 = uVar16;
        }
        uVar13 = 1;
        if (9 < uVar4) {
          uVar14 = (ulong)uVar4;
          uVar5 = 4;
          do {
            uVar13 = uVar5;
            uVar6 = (uint)uVar14;
            if (uVar6 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_001ca87b;
            }
            if (uVar6 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_001ca87b;
            }
            if (uVar6 < 10000) goto LAB_001ca87b;
            uVar14 = uVar14 / 10000;
            uVar5 = uVar13 + 4;
          } while (99999 < uVar6);
          uVar13 = uVar13 + 1;
        }
LAB_001ca87b:
        local_80 = local_70;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_80,(char)uVar13 - (char)((int)uVar16 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar16 >> 0x1f) + (long)local_80),uVar13,uVar4);
        uVar14 = 0xf;
        if (local_d8 != &local_c8) {
          uVar14 = local_c8;
        }
        if (uVar14 < (ulong)(local_78 + local_d0)) {
          uVar14 = 0xf;
          if (local_80 != local_70) {
            uVar14 = local_70[0];
          }
          if (uVar14 < (ulong)(local_78 + local_d0)) goto LAB_001ca909;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_d8);
        }
        else {
LAB_001ca909:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_80);
        }
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_e8 = *plVar7;
          lStack_e0 = puVar8[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *plVar7;
          local_f8 = (long *)*puVar8;
        }
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)plVar7 = 0;
        std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_f8);
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8);
        }
        pGVar3 = local_88;
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        pBVar2 = (pGVar3->es).data;
        if ((sat.assigns.data[(uint)pBVar2[lVar15].v] != '\0') &&
           ((uint)pBVar2[lVar15].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar2[lVar15].v])) {
          std::__cxx11::string::append((char *)psVar12);
        }
        uVar16 = local_60[lVar15];
        uVar4 = -uVar16;
        if (0 < (int)uVar16) {
          uVar4 = uVar16;
        }
        uVar13 = 1;
        local_b0 = &local_a0;
        if (9 < uVar4) {
          uVar14 = (ulong)uVar4;
          uVar5 = 4;
          do {
            uVar13 = uVar5;
            uVar6 = (uint)uVar14;
            if (uVar6 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_001caa88;
            }
            if (uVar6 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_001caa88;
            }
            if (uVar6 < 10000) goto LAB_001caa88;
            uVar14 = uVar14 / 10000;
            uVar5 = uVar13 + 4;
          } while (99999 < uVar6);
          uVar13 = uVar13 + 1;
        }
LAB_001caa88:
        std::__cxx11::string::_M_construct
                  ((ulong)&local_b0,(char)uVar13 - (char)((int)uVar16 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)local_b0 + (ulong)(uVar16 >> 0x1f)),uVar13,uVar4);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1dcf8f);
        puVar10 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar10) {
          local_c8 = *puVar10;
          lStack_c0 = puVar8[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *puVar10;
          local_d8 = (ulong *)*puVar8;
        }
        local_d0 = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_e8 = *plVar7;
          lStack_e0 = puVar8[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *plVar7;
          local_f8 = (long *)*puVar8;
        }
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_f8);
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8);
        }
        this = local_88;
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        std::__cxx11::string::append((char *)psVar12);
        uVar16 = (this->es).sz;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)uVar16);
  }
  std::__cxx11::string::append((char *)psVar12);
  return psVar12;
}

Assistant:

std::string GraphPropagator::available_to_dot(int* arr) {
	std::string res = "graph {\n";
	for (int n = 0; n < nbNodes(); n++) {
		if (getNodeVar(n).isFixed() && getNodeVar(n).isTrue()) {
			res += " " + std::to_string(n) + " [color = red];\n";
		}
	}
	for (int e = 0; e < nbEdges(); e++) {
		if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isTrue()) {
			res += " " + std::to_string(getTail(e)) + " -- " + std::to_string(getHead(e));
			if (getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
				res += " [color = red] ";
			}
			res += "[label = \"" + std::to_string(arr[e]) + "\"]";
			res += ";\n";
		}
	}
	res += "}";

	return res;
}